

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O1

Element * __thiscall
Rml::ElementDocument::FindNextTabElement
          (ElementDocument *this,Element *current_element,bool forward)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CanFocus CVar5;
  Element *pEVar6;
  Element *element;
  ElementDocument *element_00;
  ElementDocument *pEVar7;
  undefined7 in_register_00000011;
  bool bVar8;
  int index;
  int iVar9;
  ElementDocument *local_68;
  ElementDocument *local_48;
  ElementDocument *local_40;
  
  if ((int)CONCAT71(in_register_00000011,forward) != 0) {
    iVar3 = Element::GetNumChildren(current_element,false);
    bVar8 = 0 < iVar3;
    if (0 < iVar3) {
      pEVar6 = Element::GetChild(current_element,0);
      iVar3 = 1;
      pEVar6 = SearchFocusSubtree(this,pEVar6,true);
      local_68 = (ElementDocument *)pEVar6;
      while (local_68 == (ElementDocument *)0x0) {
        iVar4 = Element::GetNumChildren(current_element,false);
        bVar8 = iVar3 < iVar4;
        local_68 = (ElementDocument *)pEVar6;
        if (iVar4 <= iVar3) break;
        element = Element::GetChild(current_element,iVar3);
        local_68 = (ElementDocument *)SearchFocusSubtree(this,element,true);
        iVar3 = iVar3 + 1;
      }
    }
    if (bVar8) {
      return &local_68->super_Element;
    }
  }
  element_00 = Element::GetOwnerDocument(current_element);
  local_48 = (ElementDocument *)Element::GetParentNode(current_element);
  local_40 = (ElementDocument *)current_element;
  do {
    bVar8 = false;
    if (local_40 == element_00) {
      if ((element_00 == (ElementDocument *)current_element) ||
         (CVar5 = anon_unknown_0::CanFocusElement(&element_00->super_Element), local_68 = element_00
         , CVar5 != Yes)) {
        iVar3 = Element::GetNumChildren(&element_00->super_Element,false);
        if (0 < iVar3) {
          iVar4 = 0;
          do {
            iVar3 = iVar3 + -1;
            iVar9 = iVar3;
            if (forward) {
              iVar9 = iVar4;
            }
            pEVar6 = Element::GetChild(&element_00->super_Element,iVar9);
            pEVar6 = SearchFocusSubtree(this,pEVar6,forward);
            if (pEVar6 != (Element *)0x0) {
              return pEVar6;
            }
            iVar4 = iVar4 + 1;
          } while (iVar3 != 0);
        }
        local_68 = (ElementDocument *)0x0;
      }
      return &local_68->super_Element;
    }
    iVar3 = Element::GetNumChildren(&local_48->super_Element,false);
    bVar1 = 0 < iVar3;
    if (0 < iVar3) {
      iVar9 = 1;
      iVar4 = iVar3;
      do {
        iVar4 = iVar4 + -1;
        index = iVar9 + -1;
        if (!forward) {
          index = iVar4;
        }
        pEVar7 = (ElementDocument *)Element::GetChild(&local_48->super_Element,index);
        if ((bVar8) &&
           (pEVar6 = SearchFocusSubtree(this,(Element *)pEVar7,forward), pEVar6 != (Element *)0x0))
        {
          bVar2 = false;
          local_68 = (ElementDocument *)pEVar6;
        }
        else {
          if (pEVar7 == local_40) {
            bVar8 = true;
          }
          bVar2 = true;
        }
        if (!bVar2) break;
        bVar1 = iVar9 < iVar3;
        iVar9 = iVar9 + 1;
      } while (iVar4 != 0);
    }
    if (bVar1) {
      return &local_68->super_Element;
    }
    pEVar7 = (ElementDocument *)Element::GetParentNode(&local_48->super_Element);
    local_40 = local_48;
    local_48 = pEVar7;
  } while( true );
}

Assistant:

Element* ElementDocument::FindNextTabElement(Element* current_element, bool forward)
{
	// This algorithm is quite sneaky, I originally thought a depth first search would work, but it appears not. What is
	// required is to cut the tree in half along the nodes from current_element up the root and then either traverse the
	// tree in a clockwise or anticlock wise direction depending if you're searching forward or backward respectively.

	// If we're searching forward, check the immediate children of this node first off.
	if (forward)
	{
		for (int i = 0; i < current_element->GetNumChildren(); i++)
			if (Element* result = SearchFocusSubtree(current_element->GetChild(i), forward))
				return result;
	}

	// Now walk up the tree, testing either the bottom or top
	// of the tree, depending on whether we're going forward
	// or backward respectively.
	bool search_enabled = false;
	Element* document = current_element->GetOwnerDocument();
	Element* child = current_element;
	Element* parent = current_element->GetParentNode();
	while (child != document)
	{
		const int num_children = parent->GetNumChildren();
		for (int i = 0; i < num_children; i++)
		{
			// Calculate index into children
			const int child_index = forward ? i : (num_children - i - 1);
			Element* search_child = parent->GetChild(child_index);

			// Do a search if its enabled
			if (search_enabled)
				if (Element* result = SearchFocusSubtree(search_child, forward))
					return result;

			// Enable searching when we reach the child.
			if (search_child == child)
				search_enabled = true;
		}

		// Advance up the tree
		child = parent;
		parent = parent->GetParentNode();
		search_enabled = false;
	}

	// We could not find anything to focus along this direction.

	// If we can focus the document, then focus that now.
	if (current_element != document && CanFocusElement(document) == CanFocus::Yes)
		return document;

	// Otherwise, search the entire document tree. This way we will wrap around.
	const int num_children = document->GetNumChildren();
	for (int i = 0; i < num_children; i++)
	{
		const int child_index = forward ? i : (num_children - i - 1);
		if (Element* result = SearchFocusSubtree(document->GetChild(child_index), forward))
			return result;
	}

	return nullptr;
}